

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

void pmccntr_op_start(CPUARMState_conflict *env)

{
  uint64_t *puVar1;
  ulong uVar2;
  _Bool _Var3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar4 = qemu_clock_get_ns(QEMU_CLOCK_VIRTUAL);
  _Var3 = pmu_counter_enabled(env,'\x1f');
  if (_Var3) {
    uVar2 = (env->cp15).c9_pmcr;
    uVar5 = uVar4 >> 6;
    if ((uVar2 & 8) == 0) {
      uVar5 = uVar4;
    }
    uVar5 = uVar5 - (env->cp15).c15_ccnt_delta;
    uVar6 = 0x8000000000000000;
    if ((uVar2 & 0x40) == 0) {
      uVar6 = 0x80000000;
    }
    if ((uVar6 & (env->cp15).c15_ccnt & ~uVar5) != 0) {
      puVar1 = &(env->cp15).c9_pmovsr;
      *puVar1 = *puVar1 | 0xffffffff80000000;
    }
    (env->cp15).c15_ccnt = uVar5;
  }
  (env->cp15).c15_ccnt_delta = uVar4;
  return;
}

Assistant:

static void pmccntr_op_start(CPUARMState *env)
{
    uint64_t cycles = cycles_get_count(env);

    if (pmu_counter_enabled(env, 31)) {
        uint64_t eff_cycles = cycles;
        if (env->cp15.c9_pmcr & PMCRD) {
            /* Increment once every 64 processor clock cycles */
            eff_cycles /= 64;
        }

        uint64_t new_pmccntr = eff_cycles - env->cp15.c15_ccnt_delta;

        uint64_t overflow_mask = env->cp15.c9_pmcr & PMCRLC ? \
                                 1ull << 63 : 1ull << 31;
        if (env->cp15.c15_ccnt & ~new_pmccntr & overflow_mask) {
            env->cp15.c9_pmovsr |= (1 << 31);
        }

        env->cp15.c15_ccnt = new_pmccntr;
    }
    env->cp15.c15_ccnt_delta = cycles;
}